

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall
JetHead::ServerSocket::bind(ServerSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  Address *this_00;
  
  this_00 = (Address *)CONCAT44(in_register_00000034,__fd);
  iVar2 = ::bind((this->super_Socket).mFd,(sockaddr *)this_00,this_00->mLen);
  if (iVar2 == 0) {
    if ((this->super_Socket).mSockStream == false) {
      Socket::setConnected(&this->super_Socket,true,1);
    }
  }
  else {
    pcVar3 = Socket::Address::getName(this_00);
    uVar1 = (this_00->mAddr).sin_port;
    jh_log_print(3,"int JetHead::ServerSocket::bind(const Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x347,"Bind Failed on %s:%d",pcVar3,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8));
  }
  return iVar2;
}

Assistant:

int ServerSocket::bind( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len;
	const struct sockaddr *saddr = addr.getAddr( len );
	int res = ::bind( getFd(), saddr, len );

	// for UDP sockets set connected on bind, since listen will not be called.
	if ( res == 0 )
	{
		if ( isSockStream() == false )
			setConnected( true );
	}
	else
		LOG_WARN_PERROR( "Bind Failed on %s:%d", 
						 addr.getName(), addr.getPort() );
		
	LOG_INFO( "bind to %s on port %d", addr.getName(), addr.getPort() );
	
	return res;
}